

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTailIdx.cpp
# Opt level: O1

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
liblogger::LogTailIdx::GetList_abi_cxx11_
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,LogTailIdx *this,uint64_t *idx,int maxitems)

{
  size_t *psVar1;
  ulong uVar2;
  bool bVar3;
  ulong in_RAX;
  mapped_type *__args;
  _Node *p_Var4;
  int iVar5;
  ulong local_38;
  
  local_38 = in_RAX;
  LogManager::Lock();
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  if (this->m_current < *idx) {
    *idx = this->m_current;
  }
  else {
    uVar2 = *(ulong *)((this->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
    if (*idx < uVar2) {
      *idx = uVar2;
    }
    local_38 = *idx;
    if (local_38 < this->m_current) {
      iVar5 = 0;
      do {
        __args = std::
                 map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->m_data,&local_38);
        p_Var4 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 _M_create_node<std::__cxx11::string_const&>
                           ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            __return_storage_ptr__,__args);
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        psVar1 = &(__return_storage_ptr__->
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        local_38 = local_38 + 1;
        if (this->m_current <= local_38) goto LAB_001357e6;
        bVar3 = iVar5 < maxitems;
        iVar5 = iVar5 + 1;
      } while (bVar3 || maxitems < 1);
      *idx = local_38;
      LogManager::Unlock();
    }
    else {
LAB_001357e6:
      *idx = this->m_current;
    }
  }
  LogManager::Unlock();
  return __return_storage_ptr__;
}

Assistant:

std::list<std::string> LogTailIdx::GetList(uint64_t *idx, int maxitems) {
	LogManagerScopedLock lock = LogManagerScopedLock();
	std::list<std::string> lst;

	if (*idx > m_current)
	{
		*idx = m_current;
		return lst;
	}

	//skip idx to first item in case it has not been used in a while
	std::map<uint64_t, std::string>::iterator it = m_data.begin();
	if (*idx < it->first)
	{
		*idx = it->first;
	}

	int count = 0;
	for(uint64_t i=*idx;i<m_current;i++)
	{
		if (maxitems > 0 && count > maxitems)
		{
			*idx = i;
			LogManager::Unlock();
			return lst;
		}
		lst.push_back(m_data[i]);
		count++;
	}
	*idx = m_current;
	return lst;
}